

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_mul_mipsel(floatx80 a,floatx80 b,float_status *status)

{
  floatx80 fVar1;
  ushort uVar2;
  uint uVar3;
  int32_t zExp;
  uint64_t zSig0;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t zSig1;
  uint uVar9;
  ushort uVar10;
  ulong uVar11;
  floatx80 fVar12;
  
  uVar7 = a.low;
  uVar8 = b.low;
  uVar5 = CONCAT71(b.low._1_7_,-1 < (long)uVar7);
  uVar2 = a.high & 0x7fff;
  if (-1 < (long)uVar7 && ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
  {
LAB_007c7521:
    status->float_exception_flags = status->float_exception_flags | 1;
    if (status->snan_bit_is_one == '\0') {
      fVar1._10_6_ = (int6)(uVar5 >> 0x10);
      fVar1.high = 0xffff;
      fVar1.low = 0xc000000000000000;
      return fVar1;
    }
    __assert_fail("!snan_bit_is_one(status)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                  ,0xc5,"floatx80 floatx80_default_nan_mipsel(float_status *)");
  }
  uVar5 = CONCAT71(b.low._1_7_,-1 < (long)uVar8);
  uVar10 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar8)
  goto LAB_007c7521;
  uVar9 = (uint)uVar2;
  uVar4 = b._8_4_ ^ a._8_4_;
  uVar5 = (ulong)uVar4;
  if (uVar2 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) ||
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        uVar10 == 0x7fff)) {
LAB_007c75a9:
      fVar12 = propagateFloatx80NaN_mipsel(a,b,status);
      return fVar12;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || uVar8 != 0) {
LAB_007c75fd:
      fVar12._8_4_ = uVar4 | 0x7fff;
      fVar12.low = 0x8000000000000000;
      fVar12._12_4_ = 0;
      return fVar12;
    }
    goto LAB_007c7521;
  }
  if (uVar10 == 0x7fff) {
    if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
    goto LAB_007c75a9;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || uVar7 != 0)
    goto LAB_007c75fd;
    goto LAB_007c7521;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar7 == 0) goto LAB_007c76a5;
    uVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar7 = uVar7 << ((byte)(uVar5 ^ 0x3f) & 0x3f);
    uVar9 = 1 - (int)(uVar5 ^ 0x3f);
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar8 == 0) {
LAB_007c76a5:
      return (floatx80)(ZEXT416(uVar4 & 0x8000) << 0x40);
    }
    uVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar8 = uVar8 << ((byte)(uVar5 ^ 0x3f) & 0x3f);
    uVar3 = 1 - (int)(uVar5 ^ 0x3f);
  }
  else {
    uVar3 = (uint)uVar10;
  }
  uVar11 = (uVar7 & 0xffffffff) * (uVar8 >> 0x20);
  uVar5 = (uVar8 & 0xffffffff) * (uVar7 >> 0x20);
  uVar6 = uVar5 + uVar11;
  zSig1 = uVar8 * uVar7;
  zSig0 = (uVar6 >> 0x20) + (uVar8 >> 0x20) * (uVar7 >> 0x20) +
          ((ulong)CARRY8(uVar5,uVar11) << 0x20) + (ulong)(zSig1 < uVar6 << 0x20);
  if ((long)zSig0 < 1) {
    zExp = uVar3 + uVar9 + -0x3ffe;
  }
  else {
    zSig0 = zSig0 * 2 | zSig1 >> 0x3f;
    zSig1 = zSig1 * 2;
    zExp = uVar3 + uVar9 + -0x3fff;
  }
  fVar12 = roundAndPackFloatx80_mipsel
                     (status->floatx80_rounding_precision,(flag)((uVar4 & 0xffff) >> 0xf),zExp,zSig0
                      ,zSig1,status);
  return fVar12;
}

Assistant:

floatx80 floatx80_mul(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    (uint64_t) ( aSig<<1 )
             || ( ( bExp == 0x7FFF ) && (uint64_t) ( bSig<<1 ) ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( bExp | bSig ) == 0 ) goto invalid;
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( ( aExp | aSig ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    zExp = aExp + bExp - 0x3FFE;
    mul64To128( aSig, bSig, &zSig0, &zSig1 );
    if ( 0 < (int64_t) zSig0 ) {
        shortShift128Left( zSig0, zSig1, 1, &zSig0, &zSig1 );
        --zExp;
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}